

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceStubTest.cpp
# Opt level: O1

void __thiscall
StackTraceTest_moveAssignment_Test::~StackTraceTest_moveAssignment_Test
          (StackTraceTest_moveAssignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(StackTraceTest, moveAssignment)
{
    StackTrace frames = StackTrace::getStackTrace();
    EXPECT_EQ(0u, frames.size());
    StackTrace other = StackTrace::getStackTrace();
    EXPECT_EQ(0u, other.size());
    other = std::move(frames);
    EXPECT_EQ(0u, other.size());
}